

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecollection.cpp
# Opt level: O0

void __thiscall CFileCollection::AddEntry(CFileCollection *this,int64 Timestamp)

{
  long lVar1;
  int iVar2;
  long in_RSI;
  CFileCollection *in_RDI;
  long in_FS_OFFSET;
  int Mid;
  int Right;
  int Left;
  char aTimestring [20];
  char aBuf [512];
  char *in_stack_fffffffffffffda8;
  int local_240;
  int local_23c;
  char local_228 [32];
  char local_208 [96];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->m_NumTimestamps == 0) {
    iVar2 = in_RDI->m_NumTimestamps;
    in_RDI->m_NumTimestamps = iVar2 + 1;
    in_RDI->m_aTimestamps[iVar2] = in_RSI;
  }
  else {
    if (in_RDI->m_NumTimestamps == in_RDI->m_MaxEntries) {
      BuildTimestring(in_RDI,in_RDI->m_aTimestamps[0],local_228);
      in_stack_fffffffffffffda8 = in_RDI->m_aFileExt;
      str_format(local_208,0x200,"%s/%s_%s%s",in_RDI->m_aPath,in_RDI->m_aFileDesc,local_228);
      (*(in_RDI->m_pStorage->super_IInterface)._vptr_IInterface[9])(in_RDI->m_pStorage,local_208,0);
    }
    if (in_RSI < in_RDI->m_aTimestamps[0]) {
      if (in_RDI->m_NumTimestamps < in_RDI->m_MaxEntries) {
        mem_move(in_RDI,in_stack_fffffffffffffda8,0);
        in_RDI->m_aTimestamps[0] = in_RSI;
        in_RDI->m_NumTimestamps = in_RDI->m_NumTimestamps + 1;
      }
    }
    else if (in_RSI < in_RDI->m_aTimestamps[in_RDI->m_NumTimestamps + -1]) {
      local_23c = 0;
      local_240 = in_RDI->m_NumTimestamps + -1;
      iVar2 = local_23c;
      while (local_23c = iVar2, 1 < local_240 - local_23c) {
        iVar2 = (local_23c + local_240) / 2;
        if (in_RSI < in_RDI->m_aTimestamps[iVar2]) {
          local_240 = iVar2;
          iVar2 = local_23c;
        }
      }
      if (in_RDI->m_NumTimestamps == in_RDI->m_MaxEntries) {
        mem_move(in_RDI,in_stack_fffffffffffffda8,0);
        in_RDI->m_aTimestamps[local_240 + -1] = in_RSI;
      }
      else {
        mem_move(in_RDI,in_stack_fffffffffffffda8,0);
        in_RDI->m_aTimestamps[local_240] = in_RSI;
        in_RDI->m_NumTimestamps = in_RDI->m_NumTimestamps + 1;
      }
    }
    else if (in_RDI->m_NumTimestamps == in_RDI->m_MaxEntries) {
      mem_move(in_RDI,in_stack_fffffffffffffda8,0);
      in_RDI->m_aTimestamps[in_RDI->m_NumTimestamps + -1] = in_RSI;
    }
    else {
      iVar2 = in_RDI->m_NumTimestamps;
      in_RDI->m_NumTimestamps = iVar2 + 1;
      in_RDI->m_aTimestamps[iVar2] = in_RSI;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CFileCollection::AddEntry(int64 Timestamp)
{
	if(m_NumTimestamps == 0)
	{
		// empty list
		m_aTimestamps[m_NumTimestamps++] = Timestamp;
	}
	else
	{
		// remove old file
		if(m_NumTimestamps == m_MaxEntries)
		{
			char aBuf[IO_MAX_PATH_LENGTH];
			char aTimestring[TIMESTAMP_LENGTH];
			BuildTimestring(m_aTimestamps[0], aTimestring);
			str_format(aBuf, sizeof(aBuf), "%s/%s_%s%s", m_aPath, m_aFileDesc, aTimestring, m_aFileExt);
			m_pStorage->RemoveFile(aBuf, IStorage::TYPE_SAVE);
		}

		// add entry to the sorted list
		if(m_aTimestamps[0] > Timestamp)
		{
			// first entry
			if(m_NumTimestamps < m_MaxEntries)
			{
				mem_move(m_aTimestamps+1, m_aTimestamps, m_NumTimestamps*sizeof(int64));
				m_aTimestamps[0] = Timestamp;
				++m_NumTimestamps;
			}
		}
		else if(m_aTimestamps[m_NumTimestamps-1] <= Timestamp)
		{
			// last entry
			if(m_NumTimestamps == m_MaxEntries)
			{
				mem_move(m_aTimestamps, m_aTimestamps+1, (m_NumTimestamps-1)*sizeof(int64));
				m_aTimestamps[m_NumTimestamps-1] = Timestamp;
			}
			else
				m_aTimestamps[m_NumTimestamps++] = Timestamp;
		}
		else
		{
			// middle entry
			int Left = 0, Right = m_NumTimestamps-1;
			while(Right-Left > 1)
			{
				int Mid = (Left+Right)/2;
				if(m_aTimestamps[Mid] > Timestamp)
					Right = Mid;
				else
					Left = Mid;
			}

			if(m_NumTimestamps == m_MaxEntries)
			{
				mem_move(m_aTimestamps, m_aTimestamps+1, (Right-1)*sizeof(int64));
				m_aTimestamps[Right-1] = Timestamp;
			}
			else
			{
				mem_move(m_aTimestamps+Right+1, m_aTimestamps+Right, (m_NumTimestamps-Right)*sizeof(int64));
				m_aTimestamps[Right] = Timestamp;
				++m_NumTimestamps;
			}
		}
	}
}